

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O2

Rtm_Man_t * Rtm_ManAlloc(Aig_Man_t *p)

{
  Rtm_Man_t *pRVar1;
  Vec_Ptr_t *pVVar2;
  Aig_MmFlex_t *pAVar3;
  
  pRVar1 = (Rtm_Man_t *)calloc(1,0x30);
  pVVar2 = Vec_PtrAlloc(p->vObjs->nSize - p->nDeleted);
  pRVar1->vObjs = pVVar2;
  pVVar2 = Vec_PtrAlloc(p->nObjs[2]);
  pRVar1->vPis = pVVar2;
  pVVar2 = Vec_PtrAlloc(p->nObjs[3]);
  pRVar1->vPos = pVVar2;
  pAVar3 = Aig_MmFlexStart();
  pRVar1->pMem = pAVar3;
  return pRVar1;
}

Assistant:

Rtm_Man_t * Rtm_ManAlloc( Aig_Man_t * p )
{
    Rtm_Man_t * pRtm;
    // start the manager
    pRtm = ABC_ALLOC( Rtm_Man_t, 1 );
    memset( pRtm, 0, sizeof(Rtm_Man_t) );
    // perform initializations
    pRtm->vObjs = Vec_PtrAlloc( Aig_ManObjNum(p) );
    pRtm->vPis  = Vec_PtrAlloc( Aig_ManCiNum(p) );
    pRtm->vPos  = Vec_PtrAlloc( Aig_ManCoNum(p) );
    pRtm->pMem  = Aig_MmFlexStart();
    return pRtm;
}